

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O0

Node * cookmem::PtrAVLTree::rotateWithLeftChild(Node *root)

{
  Node *root_00;
  Node *left;
  Node *root_local;
  
  root_00 = root->left;
  setLeftChild(root,root_00->right);
  setRightChild(root_00,root);
  updateHeight(root);
  updateHeight(root_00);
  return root_00;
}

Assistant:

inline static Node*
    rotateWithLeftChild (Node* root)
    {
        Node* left = root->left;
        setLeftChild (root, left->right);
        setRightChild (left, root);
        updateHeight (root);
        updateHeight (left);
        return left;
    }